

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall VarianceEstimator_MergeTwo_Test::TestBody(VarianceEstimator_MergeTwo_Test *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  long lVar5;
  byte bVar6;
  undefined1 *puVar7;
  long lVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  float fVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined4 in_XMM12_Da;
  undefined4 in_XMM12_Db;
  undefined8 in_XMM12_Qb;
  AssertionResult gtest_ar;
  Float varError;
  Float meanErr;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  double local_30;
  double local_28;
  float local_20;
  float local_1c;
  
  auVar31 = ZEXT864(0) << 0x40;
  auVar20 = ZEXT864(0) << 0x40;
  dVar18 = 0.0;
  dVar13 = 0.0;
  auVar30 = ZEXT864(0) << 0x40;
  auVar17 = ZEXT864(0) << 0x40;
  lVar11 = 0;
  lVar5 = 0;
  lVar8 = 0;
  puVar7 = &DAT_5851f42d4c957f2e;
  do {
    uVar9 = (uint)((ulong)puVar7 >> 0x2d) ^ (uint)((ulong)puVar7 >> 0x1b);
    bVar6 = (byte)((ulong)puVar7 >> 0x3b);
    auVar12._4_4_ = in_XMM12_Db;
    auVar12._0_4_ = in_XMM12_Da;
    auVar12._8_8_ = in_XMM12_Qb;
    auVar12 = vcvtusi2ss_avx512f(auVar12,uVar9 >> bVar6 | uVar9 << 0x20 - bVar6);
    auVar12 = vminss_avx(ZEXT416((uint)(auVar12._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    fVar22 = (auVar12._0_4_ + (float)(int)(uint)lVar8) / 1000.0;
    dVar23 = (double)(fVar22 * fVar22 * fVar22);
    if ((uint)lVar8 < 400) {
      lVar11 = lVar11 + 1;
      dVar15 = dVar23 - auVar17._0_8_;
      dVar1 = dVar15 / (double)lVar11 + auVar17._0_8_;
      auVar17 = ZEXT864((ulong)dVar1);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar15;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar23 - dVar1;
      auVar12 = vfmadd231sd_fma(auVar31._0_16_,auVar25,auVar27);
      auVar31 = ZEXT1664(auVar12);
    }
    else {
      lVar5 = lVar5 + 1;
      dVar1 = dVar23 - dVar18;
      dVar18 = dVar1 / (double)lVar5 + dVar18;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar1;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar23 - dVar18;
      auVar12 = vfmadd231sd_fma(auVar20._0_16_,auVar26,auVar28);
      auVar20 = ZEXT1664(auVar12);
    }
    dVar15 = auVar17._0_8_;
    lVar8 = lVar8 + 1;
    dVar1 = dVar23 - dVar13;
    puVar7 = (undefined1 *)((long)puVar7 * 0x5851f42d4c957f2d + 1);
    dVar13 = dVar1 / (double)lVar8 + dVar13;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar23 - dVar13;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar1;
    auVar12 = vfmadd231sd_fma(auVar30._0_16_,auVar29,auVar24);
    auVar30 = ZEXT1664(auVar12);
  } while (lVar8 != 1000);
  local_30 = auVar31._0_8_;
  local_28 = auVar12._0_8_;
  if (lVar5 != 0) {
    dVar23 = dVar18 - dVar15;
    auVar21._0_8_ = (double)lVar11;
    auVar21._8_8_ = in_XMM12_Qb;
    lVar11 = lVar11 + lVar5;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar18 * (double)lVar5;
    auVar12 = vfmadd231sd_fma(auVar19,auVar21,auVar17._0_16_);
    dVar15 = auVar12._0_8_ / (double)lVar11;
    local_30 = local_30 + auVar20._0_8_ +
               (dVar23 * dVar23 * auVar21._0_8_ * (double)lVar5) / (double)lVar11;
  }
  auVar2._8_8_ = 0x7fffffffffffffff;
  auVar2._0_8_ = 0x7fffffffffffffff;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar15 - dVar13;
  auVar12 = vandpd_avx512vl(auVar16,auVar2);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ee4f8b588e368f1;
  local_1c = (float)(auVar12._0_8_ / dVar13);
  testing::internal::CmpHelperLT<float,double>
            (local_40,"meanErr","1e-5",&local_1c,(double *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x3d3,pcVar10);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (((local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_50.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ee4f8b588e368f1;
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (double)((ulong)(1 < lVar11) * (long)(local_30 / (double)(lVar11 + -1))) - local_28 / 999.0;
  auVar12 = vandpd_avx512vl(auVar14,auVar3);
  local_20 = (float)(auVar12._0_8_ / (local_28 / 999.0));
  testing::internal::CmpHelperLT<float,double>
            (local_40,"varError","1e-5",&local_20,(double *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x3d6,pcVar10);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (((local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_50.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(VarianceEstimator, MergeTwo) {
    VarianceEstimator<double> ve[2], veBoth;

    int index = 0;
    for (Float u : Stratified1D(1000)) {
        if (index++ < 400)
            ve[0].Add(u * u * u);
        else
            ve[1].Add(u * u * u);
        veBoth.Add(u * u * u);
    }

    ve[0].Merge(ve[1]);

    Float meanErr = std::abs(ve[0].Mean() - veBoth.Mean()) / veBoth.Mean();
    EXPECT_LT(meanErr, 1e-5);

    Float varError = std::abs(ve[0].Variance() - veBoth.Variance()) / veBoth.Variance();
    EXPECT_LT(varError, 1e-5);
}